

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_test.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  buddy_allocator *this;
  ostream *poVar2;
  void *pvVar3;
  size_t allocated_size;
  ulong uVar4;
  size_t j;
  ulong uVar5;
  size_t sVar6;
  size_t i_1;
  long lVar7;
  ulong uVar8;
  size_t __size;
  int i;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  vector<void_*,_std::allocator<void_*>_> ptrs;
  void *tmp;
  
  this = (buddy_allocator *)malloc(0xa00000);
  cppcms::impl::buddy_allocator::buddy_allocator(this,0xa00000);
  cppcms::impl::buddy_allocator::test_free(this);
  iVar10 = 0;
  for (iVar9 = 0; iVar9 != 1000; iVar9 = iVar9 + 1) {
    if ((uint)(iVar9 * 100) % 1000 == 0) {
      *(undefined8 *)(std::_Rb_tree_decrement + *(long *)(std::cout + -0x18)) = 5;
      poVar2 = std::ostream::_M_insert<double>((double)(iVar9 * 100) / 1000.0);
      poVar2 = std::operator<<(poVar2,"%");
      std::operator<<(poVar2,"\b\b\b\b\b\b");
      std::ostream::flush();
    }
    iVar1 = rand();
    uVar5 = (ulong)(long)iVar1 % 100;
    iVar1 = rand();
    uVar8 = (ulong)(uint)(1 << ((byte)(iVar1 % 0x16) & 0x1f));
    iVar1 = rand();
    if (memory[uVar5] != (void *)0x0) {
      cppcms::impl::buddy_allocator::free_page(this,(page *)((long)memory[uVar5] + -0x10));
      memory[uVar5] = (void *)0x0;
      check_all();
    }
    __size = (uVar8 - 1 & (long)iVar1) + uVar8;
    pvVar3 = cppcms::impl::buddy_allocator::malloc(this,__size);
    memory[uVar5] = pvVar3;
    if (pvVar3 == (void *)0x0) {
      check_all();
      iVar10 = iVar10 + 1;
    }
    else {
      sizes[uVar5] = __size;
      iVar1 = rand();
      vals[uVar5] = (char)iVar1;
      pvVar3 = memory[uVar5];
      for (sVar6 = 0; __size != sVar6; sVar6 = sVar6 + 1) {
        *(char *)((long)pvVar3 + sVar6) = (char)iVar1;
      }
      check_all();
    }
    cppcms::impl::buddy_allocator::test_consistent(this,memory,100);
  }
  for (lVar7 = 0; lVar7 != 800; lVar7 = lVar7 + 8) {
    if (*(long *)((long)memory + lVar7) != 0) {
      cppcms::impl::buddy_allocator::free_page
                (this,(page *)(*(long *)((long)memory + lVar7) + -0x10));
      *(undefined8 *)((long)memory + lVar7) = 0;
      check_all();
    }
    cppcms::impl::buddy_allocator::test_consistent(this,memory,100);
  }
  cppcms::impl::buddy_allocator::test_free(this);
  std::operator<<((ostream *)&std::cout,"\n malloc fail to all ");
  poVar2 = std::ostream::_M_insert<double>(((double)iVar10 / 1000.0) * 100.0);
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar10 = 0;
  do {
    if (iVar10 == 2) {
      free(this);
      std::operator<<((ostream *)&std::cout,"Ok\n");
      return 0;
    }
    uVar5 = 1;
    while( true ) {
      if (0x9fffff < uVar5) break;
      poVar2 = std::operator<<((ostream *)&std::cout,"Object size ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
      ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      tmp = (void *)0x0;
      while( true ) {
        tmp = cppcms::impl::buddy_allocator::malloc(this,uVar5);
        if (tmp == (void *)0x0) break;
        std::vector<void_*,_std::allocator<void_*>_>::push_back(&ptrs,&tmp);
        allocated_size =
             (long)ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
        if ((allocated_size * 100) % (0xa00000 / (uVar5 & 0xffffffff)) == 0) {
          cppcms::impl::buddy_allocator::test_consistent
                    (this,ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start,allocated_size);
        }
      }
      if (ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
                  (&ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>);
        break;
      }
      cppcms::impl::buddy_allocator::test_consistent
                (this,ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                 (long)ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
      if (iVar10 == 0) {
        lVar12 = 0;
        uVar11 = 0;
        lVar7 = 0;
        for (uVar8 = 0;
            uVar8 < (ulong)((long)ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
          cppcms::impl::buddy_allocator::free
                    (this,*(void **)((long)ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar7));
          *(undefined8 *)
           ((long)ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar7) = 0;
          uVar4 = (long)ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3;
          if (uVar11 % uVar4 == 0) {
            cppcms::impl::buddy_allocator::test_consistent
                      (this,(void **)((long)ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar7),
                       uVar4 + lVar12);
          }
          lVar7 = lVar7 + 8;
          uVar11 = uVar11 + 100;
          lVar12 = lVar12 + -1;
        }
      }
      else {
        uVar11 = (ulong)((long)ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
        uVar8 = uVar11 * 100;
        while( true ) {
          uVar11 = uVar11 - 1;
          uVar8 = uVar8 - 100;
          if ((int)(uint)uVar11 < 0) break;
          uVar4 = (ulong)((uint)uVar11 & 0x7fffffff);
          cppcms::impl::buddy_allocator::free
                    (this,ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4]);
          ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar4] = (void *)0x0;
          if ((uVar8 & 0xffffffff) %
              (ulong)((long)ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) == 0) {
            cppcms::impl::buddy_allocator::test_consistent
                      (this,ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_start,uVar4);
          }
        }
      }
      cppcms::impl::buddy_allocator::test_free(this);
      std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
                (&ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>);
      uVar5 = uVar5 * 2;
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

int main()
{
	size_t memory_size = 1024*1024*10ULL;
	void *ptr = malloc(memory_size);
	cppcms::impl::buddy_allocator *buddy=new(ptr) cppcms::impl::buddy_allocator(memory_size);
	try{
		int fail = 0;

		int limit = 1000;

		buddy->test_free();
		for(int i=0;i<limit;i++) {
			if(i*100 % limit==0)
				std::cout << std::setw(5) << i*100.0 / limit << "%"<< "\b\b\b\b\b\b" << std::flush;
			size_t pos = rand() % objects;
			size_t size = (1 << (rand() % 22));
			size += rand() % size;
			if(memory[pos]) {
				buddy->free(memory[pos]);
				memory[pos] = 0;
				check_all();
			}
			if((memory[pos]=buddy->malloc(size))==0) {
				check_all();
				fail++;
			}
			else {
				sizes[pos] = size;
				char c=rand();
				vals[pos] = c;
				char *s = static_cast<char *>(memory[pos]);
				for(size_t j=0;j<size;j++)
					s[j] = c;
				check_all();
			}
			buddy->test_consistent(memory,objects);
		}
		for(size_t i=0;i<objects;i++) {
			if(memory[i]) {
				buddy->free(memory[i]);
				memory[i]=0;
				check_all();
			}
			buddy->test_consistent(memory,objects);
		}

		buddy->test_free();
		std::cout << "\n malloc fail to all " << double(fail) / limit * 100 << std::endl;
		for(int dir=0;dir<=1;dir++) {
			for(size_t i=1;i<memory_size;i*=2) {
				std::cout << "Object size " << i << std::endl;
				std::vector<void *> ptrs;
				void *tmp=0;
				size_t exp =  memory_size / i;
				while((tmp=buddy->malloc(i))!=0) {
					ptrs.push_back(tmp);
					if(ptrs.size() * 100 % exp==0)
						buddy->test_consistent(&ptrs[0],ptrs.size());
				}
				if(ptrs.empty())
					break;
				buddy->test_consistent(&ptrs[0],ptrs.size());
				if(dir == 0) {
					for(size_t i=0;i<ptrs.size();i++) {
						buddy->free(ptrs[i]);
						ptrs[i]=0;
						if(i*100 % ptrs.size() == 0)
							buddy->test_consistent(&ptrs[0]+i,ptrs.size()-i);
					}
				}
				else {
					for(int i=ptrs.size()-1;i>=0;i--) {
						buddy->free(ptrs[i]);
						ptrs[i]=0;
						if(i*100 % ptrs.size() == 0)
							buddy->test_consistent(&ptrs[0],i);
					}
				}
				buddy->test_free();
			}
		}

	}
	catch(std::exception const &e) {
		std::cerr << "Fail " << e.what() << std::endl;
		return 1;
	}
	buddy->~buddy_allocator();
	free(ptr);
	std::cout << "Ok\n";
}